

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_16ac71::ProducedDirectoryNodeTask::provideValue
          (ProducedDirectoryNodeTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  Command *pCVar1;
  BuildKey *this_00;
  char *pcVar2;
  StringRef path;
  TaskInterface ti_local;
  StringList local_138;
  string local_120 [32];
  BuildValue value;
  BuildValue local_90;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  if (inputID == 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->directorySignature,valueData);
    return;
  }
  if (inputID == 0) {
    llbuild::buildsystem::BuildValue::fromData(&value,valueData);
    pCVar1 = this->producingCommand;
    if (pCVar1 == (Command *)0x0) {
      __assert_fail("producingCommand",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x360,
                    "virtual void (anonymous namespace)::ProducedDirectoryNodeTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                   );
    }
    (*(pCVar1->super_JobDescriptor)._vptr_JobDescriptor[0xd])(&local_90,pCVar1,this->node,&value);
    llbuild::buildsystem::BuildValue::operator=(&this->nodeResult,&local_90);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_90);
    if ((this->nodeResult).kind == ExistingInput) {
      this_00 = (BuildKey *)(this->node->name)._M_dataplus._M_p;
      pcVar2 = (char *)(this->node->name)._M_string_length;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = (char *)0x0;
      }
      else if ((this_00[-1].key.key.field_2._M_local_buf + 0xf)[(long)pcVar2] == '/') {
        if ((pcVar2 == (char *)0x1) && (*(char *)&(this_00->key).key._M_dataplus._M_p == '/')) {
          pcVar2 = (char *)0x1;
        }
        else {
          pcVar2 = pcVar2 + -1;
        }
      }
      local_138.contents = (char *)0x0;
      local_138.size = 0;
      path.Length = (size_t)&local_138;
      path.Data = pcVar2;
      llbuild::buildsystem::BuildKey::makeDirectoryTreeSignature
                ((BuildKey *)local_120,this_00,path,(StringList *)key);
      std::__cxx11::string::string((string *)&local_90,local_120);
      llbuild::core::TaskInterface::request(&ti_local,(KeyType *)&local_90,1);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      llbuild::basic::StringList::~StringList(&local_138);
      this->returnDirectorySignature = true;
    }
    llbuild::buildsystem::BuildValue::~BuildValue(&value);
  }
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    if (inputID == 0) {
      auto value = BuildValue::fromData(valueData);

      // Extract the node result from the command.
      assert(producingCommand);

      // NOTE: nodeResult only contains stat info of the directory, not its signature.
      nodeResult = producingCommand->getResultForOutput(&node, value);

      if (nodeResult.isExistingInput()) {
        // The external command must have produced the directory node.
        // Request for its signature and store it

        StringRef path =  node.getName();
        if (path.endswith("/") && path != "/") {
          path = path.substr(0, path.size() - 1);
        }
        ti.request(BuildKey::makeDirectoryTreeSignature(path,basic::StringList()).toData(), /*inputID=*/1);
        returnDirectorySignature = true;
      }
    } else if (inputID == 1) {
      directorySignature = valueData;
    }
  }